

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O1

int ztlex_ishex(ztlex_t *lex)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (*lex->getC)(lex);
  uVar4 = (ulong)uVar1;
  if (uVar1 != 0xffffffff) {
    if (uVar1 == 0x30) {
      lex->lexeme[0] = '0';
      iVar2 = (*lex->getC)(lex);
      uVar4 = 1;
      if (iVar2 != -1) {
        if (iVar2 == 0x78) {
          iVar2 = 0x78;
          uVar8 = 0;
          do {
            uVar7 = uVar8;
            lex->lexeme[uVar7 + 1] = (char)iVar2;
            uVar8 = uVar7 + 1;
            iVar2 = (*lex->getC)(lex);
            ppuVar3 = __ctype_b_loc();
            if (0xfd < uVar8) break;
          } while (((*ppuVar3)[iVar2] & 0x1000) != 0);
          if ((iVar2 != -1) && (((*ppuVar3)[iVar2] & 0x1000) == 0)) {
            (*lex->ungetC)(iVar2,lex);
          }
          uVar4 = uVar7 + 2;
          if (1 < uVar8) {
            lex->lexeme[uVar7 + 2] = '\0';
            goto LAB_00104076;
          }
        }
        else {
          (*lex->ungetC)(iVar2,lex);
        }
      }
      lVar5 = uVar4 + 0x127;
      do {
        (*lex->ungetC)((int)lex->ungotten[lVar5 + -0x10],lex);
        lVar6 = lVar5 + -0x127;
        lVar5 = lVar5 + -1;
      } while (1 < lVar6);
    }
    else {
      (*lex->ungetC)(uVar1,lex);
    }
    uVar4 = 0;
  }
LAB_00104076:
  return (int)uVar4;
}

Assistant:

int ztlex_ishex(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (c != '0')
  {
    lex->ungetC(c, lex);
    return 0;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (c != 'x') /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  do
  {
    lex->lexeme[i++] = c;
    c = lex->getC(lex);
  }
  while (isxdigit(c) && i < MAXLEXEME - 1);

  if (c != EOF && !isxdigit(c))
    lex->ungetC(c, lex);

  if (i < 3)
  {
undo:
    while (--i >= 0)
      lex->ungetC(lex->lexeme[i], lex);
    return 0;
  }

  lex->lexeme[i] = '\0';
  return i;
}